

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall btMultiBody::setJointVelMultiDof(btMultiBody *this,int i,btScalar *qdot)

{
  float fVar1;
  btMultibodyLink *pbVar2;
  float *pfVar3;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int dof;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                       ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
    if (pbVar2->m_dofCount <= local_1c) break;
    fVar1 = *(float *)(in_RDX + (long)local_1c * 4);
    pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                       ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
    pfVar3 = btAlignedObjectArray<float>::operator[]
                       ((btAlignedObjectArray<float> *)(in_RDI + 0xf0),
                        pbVar2->m_dofOffset + 6 + local_1c);
    *pfVar3 = fVar1;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void btMultiBody::setJointVelMultiDof(int i, btScalar *qdot)
{
	for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		m_realBuf[6 + m_links[i].m_dofOffset + dof] = qdot[dof];
}